

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

bool __thiscall
dap::BasicTypeInfo<std::vector<dap::GotoTarget,_std::allocator<dap::GotoTarget>_>_>::serialize
          (BasicTypeInfo<std::vector<dap::GotoTarget,_std::allocator<dap::GotoTarget>_>_> *this,
          Serializer *s,void *ptr)

{
  bool bVar1;
  void *ptr_local;
  Serializer *s_local;
  BasicTypeInfo<std::vector<dap::GotoTarget,_std::allocator<dap::GotoTarget>_>_> *this_local;
  
  bVar1 = Serializer::serialize<dap::GotoTarget>(s,(array<dap::GotoTarget> *)ptr);
  return bVar1;
}

Assistant:

inline bool serialize(Serializer* s, const void* ptr) const override {
    return s->serialize(*reinterpret_cast<const T*>(ptr));
  }